

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionIDTestCase.cpp
# Opt level: O0

void __thiscall SuiteSessionIDTests::TeststreamOut::TeststreamOut(TeststreamOut *this)

{
  char *suiteName;
  TeststreamOut *this_local;
  
  suiteName = SuiteSessionIDTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"streamOut",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionIDTestCase.cpp"
             ,0x65);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TeststreamOut_004599f0;
  return;
}

Assistant:

TEST(streamOut)
{
  SessionID object( BeginString( "FIX.4.2" ),
                    SenderCompID( "SENDER" ),
                    TargetCompID( "TARGET" ) );

  std::stringstream strstream;
  strstream << object;
  CHECK_EQUAL( "FIX.4.2:SENDER->TARGET", strstream.str() );
}